

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Mapping.c
# Opt level: O0

_Bool X86_insn_reg_att2(uint id,x86_reg *reg1,x86_reg *reg2)

{
  uint local_24;
  uint i;
  x86_reg *reg2_local;
  x86_reg *reg1_local;
  uint id_local;
  
  local_24 = 0;
  while( true ) {
    if (5 < local_24) {
      return false;
    }
    if (insn_regs_intel2[local_24].insn == id) break;
    local_24 = local_24 + 1;
  }
  *reg1 = insn_regs_intel2[local_24].reg2;
  *reg2 = insn_regs_intel2[local_24].reg1;
  return true;
}

Assistant:

bool X86_insn_reg_att2(unsigned int id, x86_reg *reg1, x86_reg *reg2)
{
	unsigned int i;

	for (i = 0; i < ARR_SIZE(insn_regs_intel2); i++) {
		if (insn_regs_intel2[i].insn == id) {
			// reverse order of Intel syntax registers
			*reg1 = insn_regs_intel2[i].reg2;
			*reg2 = insn_regs_intel2[i].reg1;
			return true;
		}
	}

	// not found
	return false;
}